

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall c4::yml::Parser::_pop_level(Parser *this)

{
  pfn_error p_Var1;
  State *pSVar2;
  code *pcVar3;
  Location LVar4;
  undefined1 auVar5 [24];
  bool bVar6;
  NodeData *pNVar7;
  size_t sVar8;
  State *pSVar9;
  csubstr cVar10;
  char msg [35];
  undefined5 uStack_45;
  size_t local_20;
  
  if ((this->m_state->flags & 4) == 0) {
    pNVar7 = Tree::_p(this->m_tree,this->m_state->node_id);
    if (((pNVar7->m_type).type & MAP) != NOTYPE) goto LAB_0020eff3;
  }
  else {
LAB_0020eff3:
    _stop_map(this);
  }
  if ((this->m_state->flags & 8) == 0) {
    pNVar7 = Tree::_p(this->m_tree,this->m_state->node_id);
    if (((pNVar7->m_type).type & SEQ) == NOTYPE) goto LAB_0020f021;
  }
  _stop_seq(this);
LAB_0020f021:
  pNVar7 = Tree::_p(this->m_tree,this->m_state->node_id);
  if (((pNVar7->m_type).type & DOC) != NOTYPE) {
    _stop_doc(this);
  }
  if ((this->m_stack).m_size < 2) {
    builtin_strncpy(msg + 0x10,"_stack.s",8);
    builtin_strncpy(msg,"check failed: (m",0x10);
    builtin_strncpy(msg + 0x18,"ize() > 1)",0xb);
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    p_Var1 = (this->m_stack).m_callbacks.m_error;
    cVar10 = to_csubstr(
                       "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                       );
    local_20 = cVar10.len;
    auVar5 = ZEXT1224(ZEXT412(0x7742) << 0x40);
    LVar4.name.str._0_4_ = (int)cVar10.str;
    LVar4.super_LineCol.offset = auVar5._0_8_;
    LVar4.super_LineCol.line = auVar5._8_8_;
    LVar4.super_LineCol.col = auVar5._16_8_;
    LVar4.name.str._4_4_ = cVar10.str._4_4_;
    LVar4.name.len = local_20;
    (*p_Var1)(msg,0x23,LVar4,(this->m_stack).m_callbacks.m_user_data);
  }
  _prepare_pop(this);
  detail::stack<c4::yml::Parser::State,_16UL>::pop(&this->m_stack);
  sVar8 = (this->m_stack).m_size;
  if (sVar8 == 0) {
    if (((byte)s_error_flags & 1) != 0) {
      bVar6 = is_debugger_attached();
      if (bVar6) {
        pcVar3 = (code *)swi(3);
        (*pcVar3)();
        return;
      }
    }
    join_0x00000010_0x00000000_ =
         to_csubstr(
                   "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                   );
    msg[0] = '\0';
    msg[1] = '\0';
    msg[2] = '\0';
    msg[3] = '\0';
    msg[4] = '\0';
    msg[5] = '\0';
    msg[6] = '\0';
    msg[7] = '\0';
    msg[8] = '\\';
    msg[9] = '\\';
    msg[10] = '\0';
    msg[0xb] = '\0';
    msg[0xc] = '\0';
    msg[0xd] = '\0';
    msg[0xe] = '\0';
    msg[0xf] = '\0';
    msg[0x10] = '\0';
    msg[0x11] = '\0';
    msg[0x12] = '\0';
    msg[0x13] = '\0';
    msg[0x14] = '\0';
    msg[0x15] = '\0';
    msg[0x16] = '\0';
    msg[0x17] = '\0';
    (*(code *)PTR_error_impl_0028c7d8)
              ("check failed: m_size > 0",0x18,(anonymous_namespace)::s_default_callbacks);
    sVar8 = (this->m_stack).m_size;
  }
  pSVar2 = (this->m_stack).m_stack;
  pSVar9 = pSVar2 + (sVar8 - 1);
  this->m_state = pSVar9;
  if (pSVar2[sVar8 - 1].line_contents.indentation == 0) {
    *(byte *)&pSVar9->flags = (byte)pSVar9->flags | 1;
  }
  return;
}

Assistant:

void Parser::_pop_level()
{
    _c4dbgpf("popping level! currnode={} currlevel={}", m_state->node_id, m_state->level);
    if(has_any(RMAP) || m_tree->is_map(m_state->node_id))
    {
        _stop_map();
    }
    if(has_any(RSEQ) || m_tree->is_seq(m_state->node_id))
    {
        _stop_seq();
    }
    if(m_tree->is_doc(m_state->node_id))
    {
        _stop_doc();
    }
    _RYML_CB_ASSERT(m_stack.m_callbacks, m_stack.size() > 1);
    _prepare_pop();
    m_stack.pop();
    m_state = &m_stack.top();
    /*if(has_any(RMAP))
    {
        _toggle_key_val();
    }*/
    if(m_state->line_contents.indentation == 0)
    {
        //_RYML_CB_ASSERT(m_stack.m_callbacks, has_none(RTOP));
        add_flags(RTOP);
    }
    _c4dbgpf("popping level: now, currnode={} currlevel={}", m_state->node_id, m_state->level);
}